

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_material.cpp
# Opt level: O0

uchar * __thiscall
FGLTexture::CreateTexBuffer
          (FGLTexture *this,int translation,int *w,int *h,FTexture *hirescheck,bool createexpanded,
          bool alphatrans)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  BYTE *pBVar5;
  byte local_101;
  int trans_1;
  int trans;
  FBitmap imgCreate;
  undefined1 local_90 [8];
  FGLBitmap bmp;
  int exx;
  int H;
  int W;
  uchar *buffer;
  bool alphatrans_local;
  bool createexpanded_local;
  FTexture *hirescheck_local;
  int *h_local;
  int *w_local;
  int translation_local;
  FGLTexture *this_local;
  
  bVar1 = FBoolCVar::operator_cast_to_bool(&gl_texture_usehires);
  if ((((!bVar1) || (hirescheck == (FTexture *)0x0)) || (alphatrans)) ||
     (this_local = (FGLTexture *)LoadHiresTexture(this,hirescheck,w,h),
     this_local == (FGLTexture *)0x0)) {
    local_101 = 0;
    if ((this->bExpandFlag & 1U) != 0) {
      local_101 = createexpanded;
    }
    bmp._52_4_ = local_101 & 1;
    iVar2 = FTexture::GetWidth(this->tex);
    iVar2 = iVar2 + bmp._52_4_ * 2;
    *w = iVar2;
    iVar3 = FTexture::GetHeight(this->tex);
    iVar3 = iVar3 + bmp._52_4_ * 2;
    *h = iVar3;
    this_local = (FGLTexture *)operator_new__((long)(iVar2 * (iVar3 + 1) * 4));
    memset(this_local,0,(long)(iVar2 * (iVar3 + 1) * 4));
    FGLBitmap::FGLBitmap((FGLBitmap *)local_90,(BYTE *)this_local,iVar2 * 4,iVar2,iVar3);
    FGLBitmap::SetTranslationInfo((FGLBitmap *)local_90,translation,alphatrans);
    if ((*(ushort *)&this->tex->field_0x31 >> 8 & 1) == 0) {
      if (translation < 1) {
        iVar4 = (*this->tex->_vptr_FTexture[4])
                          (this->tex,local_90,(ulong)(uint)bmp._52_4_,(ulong)(uint)bmp._52_4_,0,0);
        FTexture::CheckTrans(this->tex,(uchar *)this_local,iVar2 * iVar3,iVar4);
        this->bIsTransparent =
             (char)((short)(*(short *)&(this->tex->gl_info).field_0x4c << 0xe) >> 0xe);
      }
      else {
        FTexture::CopyTrueColorPixels
                  (this->tex,(FBitmap *)local_90,bmp._52_4_,bmp._52_4_,0,(FCopyInfo *)0x0);
        this->bIsTransparent = '\0';
      }
    }
    else {
      FBitmap::FBitmap((FBitmap *)&trans_1);
      bVar1 = FBitmap::Create((FBitmap *)&trans_1,iVar2,iVar3);
      if (bVar1) {
        pBVar5 = FBitmap::GetPixels((FBitmap *)&trans_1);
        memset(pBVar5,0,(long)(iVar2 * iVar3 * 4));
        iVar4 = (*this->tex->_vptr_FTexture[4])
                          (this->tex,&trans_1,(ulong)(uint)bmp._52_4_,(ulong)(uint)bmp._52_4_,0,0);
        pBVar5 = FBitmap::GetPixels((FBitmap *)&trans_1);
        FGLBitmap::CopyPixelDataRGB
                  ((FGLBitmap *)local_90,0,0,pBVar5,iVar2,iVar3,4,iVar2 * 4,0,6,(FCopyInfo *)0x0,0,0
                   ,0);
        FTexture::CheckTrans(this->tex,(uchar *)this_local,iVar2 * iVar3,iVar4);
        this->bIsTransparent =
             (char)((short)(*(short *)&(this->tex->gl_info).field_0x4c << 0xe) >> 0xe);
      }
      FBitmap::~FBitmap((FBitmap *)&trans_1);
    }
    if (createexpanded) {
      this_local = (FGLTexture *)
                   gl_CreateUpsampledTextureBuffer
                             (this->tex,(uchar *)this_local,iVar2,iVar3,w,h,
                              this->bIsTransparent != '\0');
    }
    FGLBitmap::~FGLBitmap((FGLBitmap *)local_90);
  }
  return (uchar *)this_local;
}

Assistant:

unsigned char * FGLTexture::CreateTexBuffer(int translation, int & w, int & h, FTexture *hirescheck, bool createexpanded, bool alphatrans)
{
	unsigned char * buffer;
	int W, H;


	// Textures that are already scaled in the texture lump will not get replaced
	// by hires textures
	if (gl_texture_usehires && hirescheck != NULL && !alphatrans)
	{
		buffer = LoadHiresTexture (hirescheck, &w, &h);
		if (buffer)
		{
			return buffer;
		}
	}

	int exx = bExpandFlag && createexpanded;

	W = w = tex->GetWidth() + 2 * exx;
	H = h = tex->GetHeight() + 2 * exx;


	buffer=new unsigned char[W*(H+1)*4];
	memset(buffer, 0, W * (H+1) * 4);

	FGLBitmap bmp(buffer, W*4, W, H);
	bmp.SetTranslationInfo(translation, alphatrans);

	if (tex->bComplex)
	{
		FBitmap imgCreate;

		// The texture contains special processing so it must be composited using the
		// base bitmap class and then be converted as a whole.
		if (imgCreate.Create(W, H))
		{
			memset(imgCreate.GetPixels(), 0, W * H * 4);
			int trans = tex->CopyTrueColorPixels(&imgCreate, exx, exx);
			bmp.CopyPixelDataRGB(0, 0, imgCreate.GetPixels(), W, H, 4, W * 4, 0, CF_BGRA);
			tex->CheckTrans(buffer, W*H, trans);
			bIsTransparent = tex->gl_info.mIsTransparent;
		}
	}
	else if (translation<=0)
	{
		int trans = tex->CopyTrueColorPixels(&bmp, exx, exx);
		tex->CheckTrans(buffer, W*H, trans);
		bIsTransparent = tex->gl_info.mIsTransparent;
	}
	else
	{
		// When using translations everything must be mapped to the base palette.
		// Since FTexture's method is doing exactly that by calling GetPixels let's use that here
		// to do all the dirty work for us. ;)
		tex->FTexture::CopyTrueColorPixels(&bmp, exx, exx);
		bIsTransparent = 0;
	}

	// if we just want the texture for some checks there's no need for upsampling.
	if (!createexpanded) return buffer;

	// [BB] The hqnx upsampling (not the scaleN one) destroys partial transparency, don't upsamle textures using it.
	// [BB] Potentially upsample the buffer.
	return gl_CreateUpsampledTextureBuffer ( tex, buffer, W, H, w, h, !!bIsTransparent);
}